

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

void __thiscall CSound::StopAll(CSound *this)

{
  int i;
  int local_c;
  
  lock_wait((LOCK)0x13ed59);
  for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
    if (m_aVoices[local_c].m_pSample != (CSample *)0x0) {
      if ((m_aVoices[local_c].m_Flags & 1U) == 0) {
        (m_aVoices[local_c].m_pSample)->m_PausedAt = 0;
      }
      else {
        (m_aVoices[local_c].m_pSample)->m_PausedAt = m_aVoices[local_c].m_Tick;
      }
    }
    m_aVoices[local_c].m_pSample = (CSample *)0x0;
  }
  lock_unlock((LOCK)0x13ee29);
  return;
}

Assistant:

void CSound::StopAll()
{
	// TODO: a nice fade out
	lock_wait(m_SoundLock);
	for(int i = 0; i < NUM_VOICES; i++)
	{
		if(m_aVoices[i].m_pSample)
		{
			if(m_aVoices[i].m_Flags & FLAG_LOOP)
				m_aVoices[i].m_pSample->m_PausedAt = m_aVoices[i].m_Tick;
			else
				m_aVoices[i].m_pSample->m_PausedAt = 0;
		}
		m_aVoices[i].m_pSample = 0;
	}
	lock_unlock(m_SoundLock);
}